

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiGetMemoryCommitment.cpp
# Opt level: O2

bool __thiscall
vkt::api::MemoryCommitmentTestInstance::isDeviceMemoryCommitmentOk
          (MemoryCommitmentTestInstance *this,VkMemoryRequirements memoryRequirements)

{
  int iVar1;
  int iVar2;
  VkDeviceSize VVar3;
  int iVar4;
  VkPhysicalDevice physicalDevice;
  InstanceInterface *vk;
  VkDevice device;
  DeviceInterface *vk_00;
  ulong uVar5;
  VkDeviceSize pCommittedMemoryInBytes;
  VkDeviceSize local_280;
  VkMemoryAllocateInfo memAllocInfo;
  Move<vk::Handle<(vk::HandleType)7>_> memory;
  VkPhysicalDeviceMemoryProperties pMemoryProperties;
  
  physicalDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  vk = Context::getInstanceInterface((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceMemoryProperties(&pMemoryProperties,vk,physicalDevice);
  iVar1 = (this->m_renderSize).m_data[1];
  iVar2 = (this->m_renderSize).m_data[0];
  memAllocInfo._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R32_UINT);
  iVar4 = tcu::TextureFormat::getPixelSize((TextureFormat *)&memAllocInfo);
  local_280 = (VkDeviceSize)(iVar4 * iVar1 * iVar2);
  for (uVar5 = 0; uVar5 != 0x20; uVar5 = uVar5 + 1) {
    if ((pMemoryProperties.memoryTypes[uVar5].propertyFlags & 0x10) != 0) {
      memAllocInfo.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
      memAllocInfo.pNext = (void *)0x0;
      memAllocInfo.allocationSize = local_280;
      memAllocInfo.memoryTypeIndex = (deUint32)uVar5;
      device = Context::getDevice((this->super_TestInstance).m_context);
      vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
      ::vk::allocateMemory
                ((Move<vk::Handle<(vk::HandleType)7>_> *)
                 &memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>,vk_00,device,&memAllocInfo,
                 (VkAllocationCallbacks *)0x0);
      pCommittedMemoryInBytes = 0;
      (*vk_00->_vptr_DeviceInterface[0xb])
                (vk_00,device,
                 memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal,
                 &pCommittedMemoryInBytes);
      VVar3 = pCommittedMemoryInBytes;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase
                (&memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>);
      if (VVar3 <= memoryRequirements.size) break;
    }
  }
  return uVar5 < 0x20;
}

Assistant:

bool MemoryCommitmentTestInstance::isDeviceMemoryCommitmentOk(const VkMemoryRequirements memoryRequirements)
{
	const VkFormat							colorFormat			= VK_FORMAT_R32_UINT;
	const VkPhysicalDevice					physicalDevice		= m_context.getPhysicalDevice();
	const InstanceInterface&				vki					= m_context.getInstanceInterface();
	const VkMemoryPropertyFlags				propertyFlag		= VK_MEMORY_PROPERTY_LAZILY_ALLOCATED_BIT;
	const VkPhysicalDeviceMemoryProperties	pMemoryProperties	= getPhysicalDeviceMemoryProperties(vki,physicalDevice);
	const VkDeviceSize						pixelDataSize		= m_renderSize.x() * m_renderSize.y() * mapVkFormat(colorFormat).getPixelSize();

	for (deUint32 memTypeNdx = 0u; memTypeNdx < VK_MAX_MEMORY_TYPES; ++memTypeNdx)
	{
		if((pMemoryProperties.memoryTypes[memTypeNdx].propertyFlags & propertyFlag) == propertyFlag) //if supports Lazy allocation
		{
			const VkMemoryAllocateInfo	memAllocInfo =
			{
				VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,		//	VkStructureType		sType
				NULL,										//	const void*			pNext
				pixelDataSize,								//	VkDeviceSize		allocationSize
				memTypeNdx									//	deUint32			memoryTypeIndex
			};
			const VkDevice			device					= m_context.getDevice();
			const DeviceInterface&	vkd						= m_context.getDeviceInterface();
			Move<VkDeviceMemory>	memory					= allocateMemory(vkd, device, &memAllocInfo, (const VkAllocationCallbacks*)DE_NULL);
			VkDeviceSize			pCommittedMemoryInBytes = 0u;
			vkd.getDeviceMemoryCommitment(device, memory.get(), &pCommittedMemoryInBytes);
			if(pCommittedMemoryInBytes <= memoryRequirements.size)
				return true;
		}
	}
	return false;
}